

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O2

size_t __thiscall kws::Parser::IsTemplated(Parser *this,string *buffer,size_t classnamepos)

{
  char cVar1;
  pointer pcVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  
  uVar4 = std::__cxx11::string::find((char *)buffer,0x162130);
  uVar6 = uVar4;
  do {
    uVar5 = uVar4;
    if (classnamepos <= uVar5) {
      return uVar6;
    }
    uVar4 = std::__cxx11::string::find((char *)buffer,0x162488);
    if (uVar4 != 0xffffffffffffffff) {
      pcVar2 = (buffer->_M_dataplus)._M_p;
      iVar7 = 1;
      do {
        uVar6 = uVar4 + 1;
        if (classnamepos <= uVar6) goto LAB_0011dfb2;
        cVar1 = pcVar2[uVar4 + 1];
        iVar8 = -(uint)(cVar1 == '>');
        if (cVar1 == '<') {
          iVar8 = 1;
        }
        iVar7 = iVar7 + iVar8;
        uVar4 = uVar6;
      } while (iVar7 != 0);
      bVar3 = true;
      while (uVar6 = uVar6 + 1, uVar6 < classnamepos) {
        cVar1 = pcVar2[uVar6];
        if ((cVar1 != '\r') && (cVar1 != '\n')) {
          bVar3 = (bool)(bVar3 & cVar1 == '\t');
        }
      }
      if (bVar3) {
        return uVar5;
      }
    }
LAB_0011dfb2:
    uVar4 = std::__cxx11::string::find((char *)buffer,0x162130);
    uVar6 = uVar5;
  } while( true );
}

Assistant:

size_t Parser::IsTemplated(const std::string & buffer, size_t classnamepos) const
{
  size_t templatepos = buffer.find("template",0);
  size_t returnval = templatepos;

  while(templatepos!=std::string::npos && templatepos<classnamepos)
    {
    // find the last > that corresponding to the template
    size_t p0 = buffer.find("<",templatepos);
    size_t pos = std::string::npos;
    if(p0!=std::string::npos)
      {
      size_t i=p0+1;
      unsigned int n=1;

      while(i<classnamepos && n>0)
        {
        if(buffer[i] == '<')
          {
          n++;
          }
        else if(buffer[i] == '>')
          {
          n--;
          }
        if(n==0)
          {
          pos =i;
          break;
          }
        i++;
        }
      }

    if(pos<classnamepos && pos!=std::string::npos)
      {
      bool ok = true;
      // Check if between the last > and classnamepos we don't have words
      for(size_t i=pos+1;i<classnamepos;i++)
        {
        if(buffer.c_str()[i] != 13 && buffer.c_str()[i] != '\n' && buffer.c_str()[i]!= '\t')
          {
          ok = false;
          }
        }
      if(ok)
        {
        return templatepos;
        }
      /*else
        {
        std::cout << "ERROR in Parser::IsTemplated, Cannot find proper template parameters" << std::endl;
        system("PAUSE");
        }*/
      }
    returnval = templatepos;
    templatepos = buffer.find("template",templatepos+1);
    }

  return returnval;
}